

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall cmGeneratorTarget::HaveBuildTreeRPATH(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  cmLinkImplementationLibraries *pcVar2;
  allocator local_41;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,"SKIP_BUILD_RPATH",&local_41);
  bVar1 = GetPropertyAsBool(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if ((!bVar1) &&
     (pcVar2 = GetLinkImplementationLibraries(this,config),
     pcVar2 != (cmLinkImplementationLibraries *)0x0)) {
    return (pcVar2->Libraries).super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>.
           _M_impl.super__Vector_impl_data._M_start !=
           (pcVar2->Libraries).super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  }
  return false;
}

Assistant:

bool cmGeneratorTarget::HaveBuildTreeRPATH(const std::string& config) const
{
  if (this->GetPropertyAsBool("SKIP_BUILD_RPATH"))
    {
    return false;
    }
  if(cmLinkImplementationLibraries const* impl =
     this->GetLinkImplementationLibraries(config))
    {
    return !impl->Libraries.empty();
    }
  return false;
}